

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

void __thiscall tinyxml2::XMLPrinter::PushUnknown(XMLPrinter *this,char *value)

{
  size_t size;
  
  if (this->_elementJustOpened == true) {
    this->_elementJustOpened = false;
    Putc(this,'>');
  }
  if (((this->_textDepth < 0) && (this->_firstElement == false)) && (this->_compactMode == false)) {
    Putc(this,'\n');
    (*(this->super_XMLVisitor)._vptr_XMLVisitor[0xc])(this,(ulong)(uint)this->_depth);
  }
  this->_firstElement = false;
  Write(this,"<!",2);
  size = strlen(value);
  Write(this,value,size);
  Putc(this,'>');
  return;
}

Assistant:

void XMLPrinter::PushUnknown(const char* value)
{
    SealElementIfJustOpened();
    if (_textDepth < 0 && !_firstElement && !_compactMode) {
        Putc('\n');
        PrintSpace(_depth);
    }
    _firstElement = false;

    Write("<!");
    Write(value);
    Putc('>');
}